

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5RollbackToMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  fts5TripCursors((Fts5FullTable *)pVtab);
  sqlite3Fts5StorageRollback((Fts5Storage *)pVtab[1].zErrMsg);
  return 0;
}

Assistant:

static int fts5RollbackToMethod(sqlite3_vtab *pVtab, int iSavepoint){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  UNUSED_PARAM(iSavepoint);  /* Call below is a no-op for NDEBUG builds */
  fts5CheckTransactionState(pTab, FTS5_ROLLBACKTO, iSavepoint);
  fts5TripCursors(pTab);
  return sqlite3Fts5StorageRollback(pTab->pStorage);
}